

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

RefCntAutoPtr<Diligent::IObject> * __thiscall
Diligent::RefCntAutoPtr<Diligent::IObject>::operator=
          (RefCntAutoPtr<Diligent::IObject> *this,IObject *pObj)

{
  IObject *pObj_local;
  RefCntAutoPtr<Diligent::IObject> *this_local;
  
  if (this->m_pObject != pObj) {
    if (this->m_pObject != (IObject *)0x0) {
      (*this->m_pObject->_vptr_IObject[2])();
    }
    this->m_pObject = pObj;
    if (this->m_pObject != (IObject *)0x0) {
      (*this->m_pObject->_vptr_IObject[1])();
    }
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(T* pObj) noexcept
    {
        if (m_pObject != pObj)
        {
            if (m_pObject)
                m_pObject->Release();
            m_pObject = pObj;
            if (m_pObject)
                m_pObject->AddRef();
        }
        return *this;
    }